

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundCaseExpression::Deserialize(BoundCaseExpression *this,Deserializer *deserializer)

{
  BoundCaseExpression *this_00;
  pointer pBVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundCaseExpression_*,_false> local_58;
  LogicalType return_type;
  LogicalType local_38;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&return_type,deserializer,200,"return_type");
  this_00 = (BoundCaseExpression *)operator_new(0x78);
  LogicalType::LogicalType(&local_38,&return_type);
  BoundCaseExpression(this_00,&local_38);
  local_58._M_head_impl = this_00;
  LogicalType::~LogicalType(&local_38);
  pBVar1 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                         *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::BoundCaseCheck,true>>
            (deserializer,0xc9,"case_checks",&pBVar1->case_checks);
  pBVar1 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                         *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xca,"else_expr",&pBVar1->else_expr);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_58._M_head_impl;
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundCaseExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto result = duckdb::unique_ptr<BoundCaseExpression>(new BoundCaseExpression(std::move(return_type)));
	deserializer.ReadPropertyWithDefault<vector<BoundCaseCheck>>(201, "case_checks", result->case_checks);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(202, "else_expr", result->else_expr);
	return std::move(result);
}